

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

TEXTURE_FORMAT Diligent::SRGBFormatToUnorm(TEXTURE_FORMAT Fmt)

{
  undefined2 in_register_0000003a;
  int iVar1;
  
  iVar1 = CONCAT22(in_register_0000003a,Fmt);
  switch(iVar1) {
  case 0x5b:
    iVar1 = 0x57;
    break;
  case 0x5c:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 100:
  case 0x66:
  case 0x68:
    break;
  case 0x5d:
    return TEX_FORMAT_BGRX8_UNORM;
  case 99:
    return TEX_FORMAT_BC7_UNORM;
  case 0x65:
    return TEX_FORMAT_ETC2_RGB8_UNORM;
  case 0x67:
    return TEX_FORMAT_ETC2_RGB8A1_UNORM;
  case 0x69:
    return TEX_FORMAT_ETC2_RGBA8_UNORM;
  default:
    if (iVar1 == 0x1d) {
      return TEX_FORMAT_RGBA8_UNORM;
    }
    if (iVar1 == 0x4e) {
      return TEX_FORMAT_BC3_UNORM;
    }
    if (iVar1 == 0x4b) {
      return TEX_FORMAT_BC2_UNORM;
    }
    if (iVar1 == 0x48) {
      return TEX_FORMAT_BC1_UNORM;
    }
  }
  return (TEXTURE_FORMAT)iVar1;
}

Assistant:

TEXTURE_FORMAT SRGBFormatToUnorm(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_RGBA8_UNORM_SRGB:
            return TEX_FORMAT_RGBA8_UNORM;

        case TEX_FORMAT_BC1_UNORM_SRGB:
            return TEX_FORMAT_BC1_UNORM;

        case TEX_FORMAT_BC2_UNORM_SRGB:
            return TEX_FORMAT_BC2_UNORM;

        case TEX_FORMAT_BC3_UNORM_SRGB:
            return TEX_FORMAT_BC3_UNORM;

        case TEX_FORMAT_BGRA8_UNORM_SRGB:
            return TEX_FORMAT_BGRA8_UNORM;

        case TEX_FORMAT_BGRX8_UNORM_SRGB:
            return TEX_FORMAT_BGRX8_UNORM;

        case TEX_FORMAT_BC7_UNORM_SRGB:
            return TEX_FORMAT_BC7_UNORM;

        case TEX_FORMAT_ETC2_RGB8_UNORM_SRGB:
            return TEX_FORMAT_ETC2_RGB8_UNORM;

        case TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB:
            return TEX_FORMAT_ETC2_RGB8A1_UNORM;

        case TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB:
            return TEX_FORMAT_ETC2_RGBA8_UNORM;

        default:
            return Fmt;
    }
}